

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O1

bool crnlib::texture_file_types::supports_mipmaps(format fmt)

{
  return (uint)fmt < 3;
}

Assistant:

bool texture_file_types::supports_mipmaps(format fmt)
    {
        switch (fmt)
        {
        case cFormatCRN:
        case cFormatDDS:
        case cFormatKTX:
            return true;
        default:
            break;
        }

        return false;
    }